

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

bool __thiscall
Memory::HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper>::AllocSecondary
          (HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this,void *segmentParam,
          ULONG_PTR functionStart,DWORD functionSize,ushort pdataCount,ushort xdataSize,
          SecondaryAllocation *allocation)

{
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *list;
  size_t *psVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  undefined1 uVar5;
  char cVar6;
  undefined4 *puVar7;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this_00;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar8;
  
  if (*(long *)((long)segmentParam + 8) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xaa5,"(segment->GetSecondaryAllocator())",
                       "segment->GetSecondaryAllocator()");
    if (!bVar4) goto LAB_0067588e;
    *puVar7 = 0;
  }
  if ((ulong)(this->
             super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
             ).maxAllocPageCount <
      *(long *)((long)segmentParam + 0x18) - (ulong)*(uint *)((long)segmentParam + 0x28)) {
    bVar4 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::CanAllocSecondary
                      ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xac1,"(segment->CanAllocSecondary())","segment->CanAllocSecondary()");
      if (!bVar4) goto LAB_0067588e;
      *puVar7 = 0;
    }
    uVar5 = (**(code **)**(undefined8 **)((long)segmentParam + 8))
                      (*(undefined8 **)((long)segmentParam + 8),functionStart,functionSize,
                       pdataCount,xdataSize,allocation);
  }
  else {
    this_00 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
              ::GetSegmentList(&this->
                                super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                               ,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                                segmentParam);
    cVar6 = (**(code **)**(undefined8 **)((long)segmentParam + 8))
                      (*(undefined8 **)((long)segmentParam + 8),functionStart,functionSize,
                       pdataCount,xdataSize,allocation);
    if (cVar6 == '\0') {
      uVar5 = 0;
    }
    else {
      bVar4 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::CanAllocSecondary
                        ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
      list = &(this->
              super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
              ).fullSegments;
      if (this_00 != list && !bVar4) {
        pDVar8 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 ::GetSegmentList(&this->
                                   super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                                  ,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                                   segmentParam);
        if (pDVar8 != list) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0xab4,"(this->GetSegmentList(pageSegment) == &this->fullSegments)",
                             "This segment should now be in the full list if it can\'t allocate secondary"
                            );
          if (!bVar4) goto LAB_0067588e;
          *puVar7 = 0;
        }
        Output::Trace(EmitterPhase,L"XDATA Wasted pages:%u\n",
                      (ulong)*(uint *)((long)segmentParam + 0x80));
        psVar1 = &(this->
                  super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  ).freePageCount;
        *psVar1 = *psVar1 - (ulong)*(uint *)((long)segmentParam + 0x80);
        DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
        MoveElementTo(this_00,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                              segmentParam,list);
        uVar2 = (this->
                super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                ).freePageCount;
        if (uVar2 < (this->
                    super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                    ).debugMinFreePageCount) {
          (this->
          super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          ).debugMinFreePageCount = uVar2;
        }
      }
      uVar5 = 1;
    }
  }
  if (allocation->address == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xac7,"(allocation->address != nullptr)",
                       "All segments that cannot allocate xdata should have been already moved to full segments list"
                      );
    if (!bVar4) {
LAB_0067588e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  return (bool)uVar5;
}

Assistant:

bool HeapPageAllocator<T>::AllocSecondary(void* segmentParam, ULONG_PTR functionStart, DWORD functionSize, ushort pdataCount, ushort xdataSize, SecondaryAllocation* allocation)
{
    SegmentBase<T> * segment = (SegmentBase<T> *)segmentParam;
    Assert(segment->GetSecondaryAllocator());

    bool success;
    if (this->IsPageSegment(segment))
    {
        PageSegmentBase<T>* pageSegment = static_cast<PageSegmentBase<T>*>(segment);

        // We should get the segment list BEFORE xdata allocation happens.
        DListBase<PageSegmentBase<T>> * fromSegmentList = this->GetSegmentList(pageSegment);

        success = segment->GetSecondaryAllocator()->Alloc(functionStart, functionSize, pdataCount, xdataSize, allocation);

        // If no more XDATA allocations can take place.
        if (success && !pageSegment->CanAllocSecondary() && fromSegmentList != &this->fullSegments)
        {
            AssertMsg(this->GetSegmentList(pageSegment) == &this->fullSegments, "This segment should now be in the full list if it can't allocate secondary");

            OUTPUT_TRACE(Js::EmitterPhase, _u("XDATA Wasted pages:%u\n"), pageSegment->GetFreePageCount());
            this->freePageCount -= pageSegment->GetFreePageCount();
            fromSegmentList->MoveElementTo(pageSegment, &this->fullSegments);
#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
        }
    }
    else
    {
        // A large segment should always be able to do secondary allocations
        Assert(segment->CanAllocSecondary());
        success = segment->GetSecondaryAllocator()->Alloc(functionStart, functionSize, pdataCount, xdataSize, allocation);
    }

#ifdef _M_X64
    // In ARM it's OK to have xdata size be 0
    AssertMsg(allocation->address != nullptr, "All segments that cannot allocate xdata should have been already moved to full segments list");
#endif
    return success;
}